

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t MATROSKA_MetaSeekUpdate(matroska_seekpoint *MetaSeek)

{
  ebml_element *peVar1;
  fourcc_t Id;
  bool_t bVar2;
  ebml_context *peVar3;
  size_t DataSize;
  ebml_integer *Element;
  filepos_t fVar4;
  filepos_t fVar5;
  bool bVar6;
  uint8_t local_4c [4];
  matroska_seekpoint *pmStack_48;
  uint8_t IdBuffer [4];
  err_t Err;
  size_t IdSize;
  ebml_element *Link;
  ebml_element *RSegment;
  ebml_element *WSeekPosSegmentInfo;
  ebml_element *WSeekID;
  matroska_seekpoint *MetaSeek_local;
  
  IdSize = 0;
  WSeekID = (ebml_element *)MetaSeek;
  bVar2 = Node_IsPartOf(MetaSeek,0x44564245);
  peVar1 = WSeekID;
  if (bVar2 == 0) {
    peVar3 = MATROSKA_getContextSeek();
    bVar2 = EBML_ElementIsType(peVar1,peVar3);
    if (bVar2 == 0) {
      __assert_fail("EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x1c7,"err_t MATROSKA_MetaSeekUpdate(matroska_seekpoint *)");
    }
    Link = (ebml_element *)(WSeekID->Base).Parent;
    while( true ) {
      peVar1 = Link;
      bVar6 = false;
      if (Link != (ebml_element *)0x0) {
        peVar3 = MATROSKA_getContextSegment();
        bVar2 = EBML_ElementIsType(peVar1,peVar3);
        bVar6 = bVar2 == 0;
      }
      if (!bVar6) break;
      Link = (ebml_element *)(Link->Base).Parent;
    }
    if (Link == (ebml_element *)0x0) {
      MetaSeek_local = (matroska_seekpoint *)0xfffffffffffffffd;
    }
    else {
      if (WSeekID == (ebml_element *)0x0) {
        __assert_fail("(const void*)(MetaSeek)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x1ce,"err_t MATROSKA_MetaSeekUpdate(matroska_seekpoint *)");
      }
      pmStack_48 = (matroska_seekpoint *)
                   (**(code **)((long)(WSeekID->Base).Base.VMT + 0x18))(WSeekID,0x100,&IdSize,8);
      peVar1 = WSeekID;
      MetaSeek_local = pmStack_48;
      if (pmStack_48 == (matroska_seekpoint *)0x0) {
        if (IdSize == 0) {
          MetaSeek_local = (matroska_seekpoint *)0xfffffffffffffffd;
        }
        else {
          peVar3 = MATROSKA_getContextSeekID();
          WSeekPosSegmentInfo = EBML_MasterFindFirstElt((ebml_master *)peVar1,peVar3,1,0,0);
          Id = EBML_ElementClassID((ebml_element *)IdSize);
          DataSize = EBML_FillBufferID(local_4c,4,Id);
          EBML_BinarySetData((ebml_binary *)WSeekPosSegmentInfo,local_4c,DataSize);
          peVar1 = WSeekID;
          peVar3 = MATROSKA_getContextSeekPosition();
          Element = (ebml_integer *)EBML_MasterFindFirstElt((ebml_master *)peVar1,peVar3,1,0,0);
          RSegment = (ebml_element *)Element;
          fVar4 = EBML_ElementPosition((ebml_element *)IdSize);
          fVar5 = EBML_ElementPositionData(Link);
          EBML_IntegerSetValue(Element,fVar4 - fVar5);
          MetaSeek_local = pmStack_48;
        }
      }
    }
  }
  else {
    MetaSeek_local = (matroska_seekpoint *)0x0;
  }
  return (err_t)MetaSeek_local;
}

Assistant:

err_t MATROSKA_MetaSeekUpdate(matroska_seekpoint *MetaSeek)
{
    ebml_element *WSeekID, *WSeekPosSegmentInfo, *RSegment, *Link = NULL;
    size_t IdSize;
    err_t Err;
    uint8_t IdBuffer[4];

    if (Node_IsPartOf(MetaSeek,EBML_VOID_CLASS))
        return ERR_NONE;

    assert(EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek()));
    RSegment = EBML_ElementParent(MetaSeek);
    while (RSegment && !EBML_ElementIsType(RSegment, MATROSKA_getContextSegment()))
        RSegment = EBML_ElementParent(RSegment);
    if (!RSegment)
        return ERR_INVALID_DATA;

    Err = Node_GET(MetaSeek,MATROSKA_SEEKPOINT_ELEMENT,&Link);
    if (Err != ERR_NONE)
        return Err;
    if (Link==NULL)
        return ERR_INVALID_DATA;

    WSeekID = EBML_MasterFindFirstElt((ebml_master*)MetaSeek,MATROSKA_getContextSeekID(),1,0,0);
    IdSize = EBML_FillBufferID(IdBuffer,sizeof(IdBuffer),EBML_ElementClassID(Link));
    EBML_BinarySetData((ebml_binary*)WSeekID,IdBuffer,IdSize);

    WSeekPosSegmentInfo = EBML_MasterFindFirstElt((ebml_master*)MetaSeek,MATROSKA_getContextSeekPosition(),1,0,0);
    EBML_IntegerSetValue((ebml_integer*)WSeekPosSegmentInfo, EBML_ElementPosition(Link) - EBML_ElementPositionData(RSegment));

    return Err;
}